

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_scanline_aa.h
# Opt level: O2

bool __thiscall
agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::
sweep_scanline<agg::scanline_p8>
          (rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_> *this,scanline_p8 *sl
          )

{
  int iVar1;
  span *psVar2;
  sorted_y *psVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int x;
  uint uVar7;
  cell_aa **ppcVar8;
  cell_aa **ppcVar9;
  cell_aa *pcVar10;
  int iVar11;
  
  iVar6 = this->m_scan_y;
  do {
    iVar1 = (this->m_outline).m_max_y;
    if (iVar1 < iVar6) {
LAB_0010f1f9:
      return iVar6 <= iVar1;
    }
    sl->m_last_x = 0x7ffffff0;
    psVar2 = (sl->m_spans).m_array;
    sl->m_cover_ptr = (sl->m_covers).m_array;
    sl->m_cur_span = psVar2;
    psVar2->len = 0;
    uVar4 = iVar6 - (this->m_outline).m_min_y;
    psVar3 = (this->m_outline).m_sorted_y.m_array;
    uVar7 = psVar3[uVar4].num;
    ppcVar9 = (this->m_outline).m_sorted_cells.m_array + psVar3[uVar4].start;
    iVar11 = 0;
    while (uVar7 != 0) {
      pcVar10 = *ppcVar9;
      x = pcVar10->x;
      iVar5 = pcVar10->area;
      while( true ) {
        uVar7 = uVar7 - 1;
        ppcVar8 = ppcVar9 + 1;
        iVar11 = iVar11 + pcVar10->cover;
        if ((uVar7 == 0) || (pcVar10 = *ppcVar8, ppcVar9 = ppcVar8, pcVar10->x != x)) break;
        iVar5 = iVar5 + pcVar10->area;
      }
      if (iVar5 != 0) {
        uVar4 = calculate_alpha(this,iVar11 * 0x200 - iVar5);
        if (uVar4 != 0) {
          scanline_p8::add_cell(sl,x,uVar4);
        }
        x = x + 1;
      }
      if (((uVar7 != 0) && (x < pcVar10->x)) &&
         (uVar4 = calculate_alpha(this,iVar11 * 0x200), uVar4 != 0)) {
        scanline_p8::add_span(sl,x,pcVar10->x - x,uVar4);
      }
    }
    iVar11 = this->m_scan_y;
    if ((int)((ulong)((long)sl->m_cur_span - (long)(sl->m_spans).m_array) >> 4) != 0) {
      sl->m_y = iVar11;
      this->m_scan_y = iVar11 + 1;
      goto LAB_0010f1f9;
    }
    iVar6 = iVar11 + 1;
    this->m_scan_y = iVar6;
  } while( true );
}

Assistant:

bool sweep_scanline(Scanline& sl)
        {
            for(;;)
            {
                if(m_scan_y > m_outline.max_y()) return false;
                sl.reset_spans();
                unsigned num_cells = m_outline.scanline_num_cells(m_scan_y);
                const cell_aa* const* cells = m_outline.scanline_cells(m_scan_y);
                int cover = 0;

                while(num_cells)
                {
                    const cell_aa* cur_cell = *cells;
                    int x    = cur_cell->x;
                    int area = cur_cell->area;
                    unsigned alpha;

                    cover += cur_cell->cover;

                    //accumulate all cells with the same X
                    while(--num_cells)
                    {
                        cur_cell = *++cells;
                        if(cur_cell->x != x) break;
                        area  += cur_cell->area;
                        cover += cur_cell->cover;
                    }

                    if(area)
                    {
                        alpha = calculate_alpha((cover << (poly_subpixel_shift + 1)) - area);
                        if(alpha)
                        {
                            sl.add_cell(x, alpha);
                        }
                        x++;
                    }

                    if(num_cells && cur_cell->x > x)
                    {
                        alpha = calculate_alpha(cover << (poly_subpixel_shift + 1));
                        if(alpha)
                        {
                            sl.add_span(x, cur_cell->x - x, alpha);
                        }
                    }
                }
        
                if(sl.num_spans()) break;
                ++m_scan_y;
            }

            sl.finalize(m_scan_y);
            ++m_scan_y;
            return true;
        }